

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

rcode __thiscall
olc::PixelGameEngine::Construct
          (PixelGameEngine *this,int32_t screen_w,int32_t screen_h,int32_t pixel_w,int32_t pixel_h,
          bool full_screen,bool vsync,bool cohesion)

{
  vi2d vVar1;
  vi2d vVar2;
  vi2d vVar3;
  vf2d vVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  this->bPixelCohesion = cohesion;
  vVar2.y = screen_h;
  vVar2.x = screen_w;
  this->vScreenSize = vVar2;
  auVar6._0_4_ = (float)screen_w;
  auVar6._4_4_ = (float)screen_h;
  auVar6._8_8_ = 0;
  auVar5 = divps(_DAT_00113040,auVar6);
  this->vInvScreenSize = auVar5._0_8_;
  vVar3.y = pixel_h;
  vVar3.x = pixel_w;
  this->vPixelSize = vVar3;
  vVar1.x = pixel_w * screen_w;
  vVar1.y = pixel_h * screen_h;
  this->vWindowSize = vVar1;
  auVar5._0_4_ = (float)screen_w;
  auVar5._4_4_ = auVar6._4_4_;
  auVar5._8_8_ = 0;
  this->bFullScreen = full_screen;
  this->bEnableVSYNC = vsync;
  auVar6 = divps(_DAT_00113080,auVar5);
  vVar4.x = (float)(int)auVar6._0_4_;
  vVar4.y = (float)(int)auVar6._4_4_;
  this->vPixel = vVar4;
  return (rcode)((0 < screen_h && 0 < screen_w) && (0 < pixel_h && 0 < pixel_w));
}

Assistant:

olc::rcode PixelGameEngine::Construct(int32_t screen_w, int32_t screen_h, int32_t pixel_w, int32_t pixel_h, bool full_screen, bool vsync, bool cohesion)
	{
		bPixelCohesion = cohesion;
		vScreenSize = { screen_w, screen_h };
		vInvScreenSize = { 1.0f / float(screen_w), 1.0f / float(screen_h) };
		vPixelSize = { pixel_w, pixel_h };
		vWindowSize = vScreenSize * vPixelSize;
		bFullScreen = full_screen;
		bEnableVSYNC = vsync;
		vPixel = 2.0f / vScreenSize;

		if (vPixelSize.x <= 0 || vPixelSize.y <= 0 || vScreenSize.x <= 0 || vScreenSize.y <= 0)
			return olc::FAIL;
		return olc::OK;
	}